

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O1

void __thiscall amrex::BaseFab<int>::define(BaseFab<int> *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int *piVar3;
  long lVar4;
  
  if ((long)this->nvar != 0) {
    lVar4 = (long)(((this->domain).bigend.vect[0] - (this->domain).smallend.vect[0]) + 1) *
            (long)this->nvar *
            (long)(((this->domain).bigend.vect[2] - (this->domain).smallend.vect[2]) + 1) *
            (long)(((this->domain).bigend.vect[1] - (this->domain).smallend.vect[1]) + 1);
    this->truesize = lVar4;
    this->ptr_owner = true;
    piVar3 = (int *)DataAllocator::alloc(&this->super_DataAllocator,lVar4 * 4);
    this->dptr = piVar3;
    uVar1 = *(undefined8 *)(this->domain).bigend.vect;
    uVar2 = *(undefined8 *)(this->domain).smallend.vect;
    update_fab_stats((long)(((this->domain).bigend.vect[2] - (this->domain).smallend.vect[2]) + 1) *
                     (long)(((int)uVar1 - (int)uVar2) + 1) *
                     (long)(((int)((ulong)uVar1 >> 0x20) - (int)((ulong)uVar2 >> 0x20)) + 1),
                     this->truesize,4);
    return;
  }
  return;
}

Assistant:

void
BaseFab<T>::define ()
{
    AMREX_ASSERT(this->dptr == 0);
    AMREX_ASSERT(this->domain.numPts() > 0);
    AMREX_ASSERT(this->nvar >= 0);
    if (this->nvar == 0) return;
    AMREX_ASSERT(std::numeric_limits<Long>::max()/this->nvar > this->domain.numPts());

    this->truesize  = this->nvar*this->domain.numPts();
    this->ptr_owner = true;
    this->dptr = static_cast<T*>(this->alloc(this->truesize*sizeof(T)));

    placementNew(this->dptr, this->truesize);

    amrex::update_fab_stats(this->domain.numPts(), this->truesize, sizeof(T));
}